

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_algor.cc
# Opt level: O1

void X509_ALGOR_set_md(X509_ALGOR *alg,EVP_MD *md)

{
  int n;
  ulong uVar1;
  ASN1_OBJECT *aobj;
  
  uVar1 = EVP_MD_flags(md);
  n = EVP_MD_type(md);
  aobj = OBJ_nid2obj(n);
  X509_ALGOR_set0(alg,aobj,-(uint)(((uint)uVar1 >> 1 & 1) != 0) | 5,(void *)0x0);
  return;
}

Assistant:

int X509_ALGOR_set_md(X509_ALGOR *alg, const EVP_MD *md) {
  int param_type;

  if (EVP_MD_flags(md) & EVP_MD_FLAG_DIGALGID_ABSENT) {
    param_type = V_ASN1_UNDEF;
  } else {
    param_type = V_ASN1_NULL;
  }

  return X509_ALGOR_set0(alg, OBJ_nid2obj(EVP_MD_type(md)), param_type, NULL);
}